

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineInputAssemblyTests.cpp
# Opt level: O2

TestCaseGroup * vkt::pipeline::createInputAssemblyTests(TestContext *testCtx)

{
  VkPrimitiveTopology VVar1;
  TestCaseGroup *pTVar2;
  TestNode *pTVar3;
  TestNode *this;
  InputAssemblyTest *this_00;
  TestCaseGroup *pTVar4;
  PrimitiveRestartTest *pPVar5;
  VkPrimitiveTopology topology;
  VkPrimitiveTopology topology_00;
  VkPrimitiveTopology topology_01;
  long lVar6;
  VkIndexType in_stack_ffffffffffffff20;
  allocator<char> local_d9;
  TestContext *local_d8;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> indexUint16Tests;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> indexUint32Tests;
  UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> local_a8;
  TestNode *local_98;
  TestNode *local_90;
  long local_88;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> inputAssemblyTests;
  string local_70;
  string local_50;
  
  pTVar3 = (TestNode *)operator_new(0x70);
  local_d8 = testCtx;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,testCtx,"input_assembly","Input assembly tests");
  inputAssemblyTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = (TestCaseGroup *)pTVar3;
  this = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)this,local_d8,"primitive_topology","");
  indexUint16Tests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = (TestCaseGroup *)this;
  for (lVar6 = 0;
      pTVar2 = indexUint16Tests.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
               ptr, lVar6 != 0x28; lVar6 = lVar6 + 4) {
    VVar1 = *(VkPrimitiveTopology *)
             ((long)&(anonymous_namespace)::InputAssemblyTest::s_primitiveTopologies + lVar6);
    this_00 = (InputAssemblyTest *)operator_new(0x80);
    (anonymous_namespace)::getPrimitiveTopologyCaseName_abi_cxx11_
              (&local_50,(_anonymous_namespace_ *)(ulong)VVar1,topology);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"",(allocator<char> *)&indexUint32Tests);
    anon_unknown_0::InputAssemblyTest::InputAssemblyTest
              (this_00,local_d8,&local_50,&local_70,VVar1,0,true,in_stack_ffffffffffffff20);
    (this_00->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__TestCase_00bcf358;
    tcu::TestNode::addChild(this,(TestNode *)this_00);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  indexUint16Tests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = (TestCaseGroup *)0x0;
  tcu::TestNode::addChild(pTVar3,&pTVar2->super_TestNode);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&indexUint16Tests.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  pTVar2 = inputAssemblyTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,local_d8,"primitive_restart","Restarts indices of ");
  local_a8.m_data.ptr = (TestCaseGroup *)pTVar3;
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar4,local_d8,"index_type_uint16","");
  indexUint16Tests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = pTVar4;
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  local_98 = &pTVar2->super_TestNode;
  local_90 = pTVar3;
  tcu::TestCaseGroup::TestCaseGroup(pTVar4,local_d8,"index_type_uint32","");
  lVar6 = 0;
  indexUint32Tests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = pTVar4;
  while (pTVar3 = local_90,
        pTVar2 = indexUint16Tests.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data.ptr, lVar6 != 0x14) {
    VVar1 = *(VkPrimitiveTopology *)((long)&DAT_0095d270 + lVar6);
    local_88 = lVar6;
    pPVar5 = (PrimitiveRestartTest *)operator_new(0x98);
    (anonymous_namespace)::getPrimitiveTopologyCaseName_abi_cxx11_
              (&local_50,(_anonymous_namespace_ *)(ulong)VVar1,topology_00);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_d9);
    anon_unknown_0::PrimitiveRestartTest::PrimitiveRestartTest
              (pPVar5,local_d8,&local_50,&local_70,VVar1,VK_INDEX_TYPE_UINT16);
    tcu::TestNode::addChild(&pTVar2->super_TestNode,(TestNode *)pPVar5);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    pTVar2 = indexUint32Tests.
             super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
             ptr;
    pPVar5 = (PrimitiveRestartTest *)operator_new(0x98);
    (anonymous_namespace)::getPrimitiveTopologyCaseName_abi_cxx11_
              (&local_50,(_anonymous_namespace_ *)(ulong)VVar1,topology_01);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_d9);
    anon_unknown_0::PrimitiveRestartTest::PrimitiveRestartTest
              (pPVar5,local_d8,&local_50,&local_70,VVar1,VK_INDEX_TYPE_UINT32);
    tcu::TestNode::addChild(&pTVar2->super_TestNode,(TestNode *)pPVar5);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    lVar6 = local_88 + 4;
  }
  indexUint16Tests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = (TestCaseGroup *)0x0;
  tcu::TestNode::addChild(local_90,&pTVar2->super_TestNode);
  pTVar2 = indexUint32Tests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  indexUint32Tests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = (TestCaseGroup *)0x0;
  tcu::TestNode::addChild(pTVar3,&pTVar2->super_TestNode);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&indexUint32Tests.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&indexUint16Tests.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  pTVar2 = local_a8.m_data.ptr;
  local_a8.m_data.ptr = (TestCaseGroup *)0x0;
  tcu::TestNode::addChild(local_98,&pTVar2->super_TestNode);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&local_a8);
  pTVar2 = inputAssemblyTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  inputAssemblyTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = (TestCaseGroup *)0x0;
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&inputAssemblyTests.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  return pTVar2;
}

Assistant:

tcu::TestCaseGroup* createInputAssemblyTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup>		inputAssemblyTests (new tcu::TestCaseGroup(testCtx, "input_assembly", "Input assembly tests"));

	inputAssemblyTests->addChild(createPrimitiveTopologyTests(testCtx).release());
	inputAssemblyTests->addChild(createPrimitiveRestartTests(testCtx).release());

	return inputAssemblyTests.release();
}